

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::ClearDependencies
          (cmLocalUnixMakefileGenerator3 *this,cmMakefile *mf,bool verbose)

{
  size_type sVar1;
  cmValue cVar2;
  cmState *this_00;
  cmGlobalGenerator *globalGenerator;
  string *psVar3;
  path *ppVar4;
  pointer filename;
  string_view arg;
  string_view arg_00;
  string dir;
  string internalDependFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmDependsCompiler local_9a0;
  string depsFiles;
  cmCMakePath DepTimestamp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string local_920;
  string dependFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  cmStateSnapshot snapshot;
  cmDepends clearer;
  cmMakefile lmf;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lmf,"CMAKE_DEPEND_INFO_FILES",(allocator<char> *)&clearer);
  cVar2 = cmMakefile::GetDefinition(mf,(string *)&lmf);
  std::__cxx11::string::~string((string *)&lmf);
  if (cVar2.Value != (string *)0x0) {
    arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar2.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&files,arg,false);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_920,"",(allocator<char> *)&lmf);
    cmDepends::cmDepends(&clearer,(cmLocalUnixMakefileGenerator3 *)0x0,&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    clearer.Verbose = verbose;
    for (filename = files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        filename !=
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; filename = filename + 1) {
      this_00 = cmMakefile::GetState(mf);
      cmState::CreateBaseSnapshot(&snapshot,this_00);
      globalGenerator = cmMakefile::GetGlobalGenerator(mf);
      cmMakefile::cmMakefile(&lmf,globalGenerator,&snapshot);
      cmMakefile::ReadListFile(&lmf,filename);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dir,"CMAKE_DEPENDS_LANGUAGES",(allocator<char> *)&dependFile);
      psVar3 = cmMakefile::GetSafeDefinition(&lmf,&dir);
      sVar1 = psVar3->_M_string_length;
      std::__cxx11::string::~string((string *)&dir);
      if (sVar1 != 0) {
        cmsys::SystemTools::GetFilenamePath(&dir,filename);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dependFile,&dir,"/depend.make");
        cmDepends::Clear(&clearer,&dependFile);
        std::operator+(&internalDependFile,&dir,"/depend.internal");
        cmsys::SystemTools::RemoveFile(&internalDependFile);
        std::__cxx11::string::~string((string *)&internalDependFile);
        std::__cxx11::string::~string((string *)&dependFile);
        std::__cxx11::string::~string((string *)&dir);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dir,"CMAKE_DEPENDS_DEPENDENCY_FILES",(allocator<char> *)&dependFile);
      psVar3 = cmMakefile::GetSafeDefinition(&lmf,&dir);
      std::__cxx11::string::string((string *)&depsFiles,(string *)psVar3);
      std::__cxx11::string::~string((string *)&dir);
      if (depsFiles._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_8d8,(string *)filename);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)&dependFile,&local_8d8,generic_format);
        cmCMakePath::GetParentPath((cmCMakePath *)&dir,(cmCMakePath *)&dependFile);
        std::filesystem::__cxx11::path::~path((path *)&dependFile);
        std::__cxx11::string::~string((string *)&local_8d8);
        std::filesystem::__cxx11::path::path((path *)&internalDependFile,(path *)&dir);
        ppVar4 = &cmCMakePath::Append<char[21],cmCMakePath&>
                            ((cmCMakePath *)&internalDependFile,(char (*) [21])0x5cd4e6)->Path;
        std::filesystem::__cxx11::path::path((path *)&dependFile,ppVar4);
        std::filesystem::__cxx11::path::~path((path *)&internalDependFile);
        std::filesystem::__cxx11::path::generic_string(&internalDependFile,(path *)&dependFile);
        cmDepends::Clear(&clearer,&internalDependFile);
        std::__cxx11::string::~string((string *)&internalDependFile);
        std::filesystem::__cxx11::path::path(&DepTimestamp.Path,(path *)&dir);
        ppVar4 = &cmCMakePath::Append<char[25],cmCMakePath&>
                            ((cmCMakePath *)&DepTimestamp.Path,(char (*) [25])0x5cd4cc)->Path;
        std::filesystem::__cxx11::path::path((path *)&internalDependFile,ppVar4);
        std::filesystem::__cxx11::path::~path(&DepTimestamp.Path);
        std::filesystem::__cxx11::path::generic_string
                  (&DepTimestamp.Path._M_pathname,(path *)&internalDependFile);
        cmsys::SystemTools::RemoveFile(&DepTimestamp.Path._M_pathname);
        std::__cxx11::string::~string((string *)&DepTimestamp.Path);
        std::filesystem::__cxx11::path::path((path *)&dependencies,(path *)&dir);
        ppVar4 = &cmCMakePath::Append<char[19],cmCMakePath&>
                            ((cmCMakePath *)&dependencies,(char (*) [19])0x5cddad)->Path;
        std::filesystem::__cxx11::path::path(&DepTimestamp.Path,ppVar4);
        std::filesystem::__cxx11::path::~path((path *)&dependencies);
        std::filesystem::__cxx11::path::generic_string((string *)&dependencies,&DepTimestamp.Path);
        cmsys::SystemTools::Touch((string *)&dependencies,true);
        std::__cxx11::string::~string((string *)&dependencies);
        arg_00._M_str = depsFiles._M_dataplus._M_p;
        arg_00._M_len = depsFiles._M_string_length;
        cmExpandedList_abi_cxx11_(&dependencies,arg_00,true);
        local_9a0.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)0x0;
        local_9a0.Verbose = verbose;
        cmDependsCompiler::ClearDependencies(&local_9a0,&dependencies);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&dependencies);
        std::filesystem::__cxx11::path::~path(&DepTimestamp.Path);
        std::filesystem::__cxx11::path::~path((path *)&internalDependFile);
        std::filesystem::__cxx11::path::~path((path *)&dependFile);
        std::filesystem::__cxx11::path::~path((path *)&dir);
      }
      std::__cxx11::string::~string((string *)&depsFiles);
      cmMakefile::~cmMakefile(&lmf);
    }
    cmDepends::~cmDepends(&clearer);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ClearDependencies(cmMakefile* mf,
                                                      bool verbose)
{
  // Get the list of target files to check
  cmValue infoDef = mf->GetDefinition("CMAKE_DEPEND_INFO_FILES");
  if (!infoDef) {
    return;
  }
  std::vector<std::string> files = cmExpandedList(*infoDef);

  // Each depend information file corresponds to a target.  Clear the
  // dependencies for that target.
  cmDepends clearer;
  clearer.SetVerbose(verbose);
  for (std::string const& file : files) {
    auto snapshot = mf->GetState()->CreateBaseSnapshot();
    cmMakefile lmf(mf->GetGlobalGenerator(), snapshot);
    lmf.ReadListFile(file);

    if (!lmf.GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(file);

      // Clear the implicit dependency makefile.
      std::string dependFile = dir + "/depend.make";
      clearer.Clear(dependFile);

      // Remove the internal dependency check file to force
      // regeneration.
      std::string internalDependFile = dir + "/depend.internal";
      cmSystemTools::RemoveFile(internalDependFile);
    }

    auto depsFiles = lmf.GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
    if (!depsFiles.empty()) {
      auto dir = cmCMakePath(file).GetParentPath();
      // Clear the implicit dependency makefile.
      auto depFile = cmCMakePath(dir).Append("compiler_depend.make");
      clearer.Clear(depFile.GenericString());

      // Remove the internal dependency check file
      auto internalDepFile =
        cmCMakePath(dir).Append("compiler_depend.internal");
      cmSystemTools::RemoveFile(internalDepFile.GenericString());

      // Touch timestamp file to force dependencies regeneration
      auto DepTimestamp = cmCMakePath(dir).Append("compiler_depend.ts");
      cmSystemTools::Touch(DepTimestamp.GenericString(), true);

      // clear the dependencies files generated by the compiler
      std::vector<std::string> dependencies = cmExpandedList(depsFiles, true);
      cmDependsCompiler depsManager;
      depsManager.SetVerbose(verbose);
      depsManager.ClearDependencies(dependencies);
    }
  }
}